

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O1

VkBool32 dbgFunc(VkFlags msgFlags,VkDebugReportObjectTypeEXT objType,uint64_t srcObject,
                size_t location,int32_t msgCode,char *pLayerPrefix,char *pMsg,void *pUserData)

{
  size_t sVar1;
  char *__s;
  char *__format;
  
  sVar1 = strlen(pMsg);
  __s = (char *)malloc(sVar1 + 100);
  if (__s == (char *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0xed,
                  "VkBool32 dbgFunc(VkFlags, VkDebugReportObjectTypeEXT, uint64_t, size_t, int32_t, const char *, const char *, void *)"
                 );
  }
  validation_error = 1;
  if ((msgFlags & 8) == 0) {
    if ((msgFlags & 2) == 0) {
      validation_error = 1;
      return 0;
    }
    __format = "WARNING: [%s] Code %d : %s";
  }
  else {
    __format = "ERROR: [%s] Code %d : %s";
  }
  sprintf(__s,__format,pLayerPrefix,msgCode,pMsg);
  puts(__s);
  fflush(_stdout);
  free(__s);
  return 0;
}

Assistant:

VKAPI_CALL
dbgFunc(VkFlags msgFlags, VkDebugReportObjectTypeEXT objType,
    uint64_t srcObject, size_t location, int32_t msgCode,
    const char *pLayerPrefix, const char *pMsg, void *pUserData) {
    char *message = (char *)malloc(strlen(pMsg) + 100);

    assert(message);

    validation_error = 1;

    if (msgFlags & VK_DEBUG_REPORT_ERROR_BIT_EXT) {
        sprintf(message, "ERROR: [%s] Code %d : %s", pLayerPrefix, msgCode,
            pMsg);
    } else if (msgFlags & VK_DEBUG_REPORT_WARNING_BIT_EXT) {
        sprintf(message, "WARNING: [%s] Code %d : %s", pLayerPrefix, msgCode,
            pMsg);
    } else {
        return false;
    }

    printf("%s\n", message);
    fflush(stdout);
    free(message);

    /*
    * false indicates that layer should not bail-out of an
    * API call that had validation failures. This may mean that the
    * app dies inside the driver due to invalid parameter(s).
    * That's what would happen without validation layers, so we'll
    * keep that behavior here.
    */
    return false;
}